

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  mbedtls_mpi *pmVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  mbedtls_pk_type_t mVar6;
  char *pcVar7;
  FILE *__stream;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  char cVar11;
  char *__s1;
  ulong uVar12;
  int iVar13;
  mbedtls_pk_context pk;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  char buf [1024];
  mbedtls_pk_context mStack_508;
  mbedtls_mpi local_4f8;
  mbedtls_mpi local_4e0;
  mbedtls_mpi local_4c8;
  mbedtls_mpi local_4b0;
  mbedtls_mpi local_498;
  mbedtls_mpi local_480;
  mbedtls_mpi local_468;
  mbedtls_mpi local_450;
  char local_438 [1032];
  
  mbedtls_pk_init(&mStack_508);
  memset(local_438,0,0x400);
  mbedtls_mpi_init(&local_4e0);
  mbedtls_mpi_init(&local_450);
  mbedtls_mpi_init(&local_468);
  mbedtls_mpi_init(&local_480);
  mbedtls_mpi_init(&local_4f8);
  mbedtls_mpi_init(&local_498);
  mbedtls_mpi_init(&local_4b0);
  mbedtls_mpi_init(&local_4c8);
  if (argc == 0) goto LAB_0010b4a6;
  opt.mode = 0;
  opt.filename = "keyfile.key";
  opt.password = anon_var_dwarf_1bdaf + 9;
  opt.password_file = anon_var_dwarf_1bdaf + 9;
  if (1 < argc) {
    uVar12 = 1;
    do {
      pcVar8 = argv[uVar12];
      pcVar7 = strchr(pcVar8,0x3d);
      if (pcVar7 == (char *)0x0) goto LAB_0010b4a6;
      __s1 = pcVar7 + 1;
      *pcVar7 = '\0';
      iVar5 = strcmp(pcVar8,"mode");
      if (iVar5 == 0) {
        iVar5 = strcmp(__s1,"private");
        if (iVar5 == 0) {
          opt.mode = 1;
          pcVar7 = opt.filename;
          pcVar3 = opt.password;
          pcVar4 = opt.password_file;
        }
        else {
          iVar5 = strcmp(__s1,"public");
          if (iVar5 != 0) goto LAB_0010b4a6;
          opt.mode = 2;
          pcVar7 = opt.filename;
          pcVar3 = opt.password;
          pcVar4 = opt.password_file;
        }
      }
      else {
        iVar5 = strcmp(pcVar8,"filename");
        pcVar7 = __s1;
        pcVar3 = opt.password;
        pcVar4 = opt.password_file;
        if (((iVar5 != 0) &&
            (iVar5 = strcmp(pcVar8,"password"), pcVar7 = opt.filename, pcVar3 = __s1,
            pcVar4 = opt.password_file, iVar5 != 0)) &&
           (iVar5 = strcmp(pcVar8,"password_file"), pcVar7 = opt.filename, pcVar3 = opt.password,
           pcVar4 = __s1, iVar5 != 0)) goto LAB_0010b4a6;
      }
      opt.password_file = pcVar4;
      opt.password = pcVar3;
      opt.filename = pcVar7;
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
  }
  if (opt.mode == 2) {
    printf("\n  . Loading the public key ...");
    fflush(_stdout);
    iVar5 = mbedtls_pk_parse_public_keyfile(&mStack_508,opt.filename);
    if (iVar5 == 0) {
      puts(" ok");
      puts("  . Key information    ...");
      mVar6 = mbedtls_pk_get_type(&mStack_508);
      if (mVar6 == MBEDTLS_PK_RSA) {
        iVar5 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,
                                   (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                   &local_4f8);
        if (iVar5 == 0) {
          iVar5 = mbedtls_mpi_write_file("N:  ",&local_4e0,0x10,(FILE *)0x0);
          if (iVar5 != 0) goto LAB_0010b8b6;
          iVar5 = mbedtls_mpi_write_file("E:  ",&local_4f8,0x10,(FILE *)0x0);
          cVar11 = (iVar5 != 0) * '\x03';
        }
        else {
          puts(" failed\n  ! could not export RSA parameters\n");
LAB_0010b8b6:
          cVar11 = '\x03';
        }
      }
      else {
        mVar6 = mbedtls_pk_get_type(&mStack_508);
        if (mVar6 != MBEDTLS_PK_ECKEY) {
LAB_0010b977:
          puts("Do not know how to print key information for this type");
          bVar1 = false;
          iVar13 = 1;
          iVar5 = 0;
          goto LAB_0010b4c1;
        }
        iVar5 = mbedtls_mpi_write_file
                          ("Q(X): ",(mbedtls_mpi *)
                                    &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,0x10,
                           (FILE *)0x0);
        if ((iVar5 == 0) &&
           (iVar5 = mbedtls_mpi_write_file
                              ("Q(Y): ",(mbedtls_mpi *)
                                        &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,0x10,
                               (FILE *)0x0), iVar5 == 0)) {
          pmVar2 = (mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130);
          pcVar8 = "Q(Z): ";
LAB_0010b743:
          iVar5 = mbedtls_mpi_write_file(pcVar8,(mbedtls_mpi *)&pmVar2->p,0x10,(FILE *)0x0);
          cVar11 = (iVar5 != 0) * '\x03';
        }
        else {
LAB_0010b950:
          cVar11 = '\x03';
        }
      }
joined_r0x0010b8bd:
      if (cVar11 == '\0') {
        iVar13 = 0;
        bVar1 = true;
      }
      else {
        if (cVar11 != '\x03') {
          return 0;
        }
        iVar13 = 1;
        bVar1 = false;
      }
      goto LAB_0010b4c1;
    }
    pcVar8 = " failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n";
LAB_0010b7d5:
    bVar1 = false;
    printf(pcVar8,(ulong)(uint)-iVar5);
    iVar13 = 1;
    goto LAB_0010b4c1;
  }
  if (opt.mode == 1) {
    if ((*opt.password != '\0') && (*opt.password_file != '\0')) {
      puts("Error: cannot have both password and password_file");
      goto LAB_0010b4a6;
    }
    if (*opt.password_file == '\0') {
LAB_0010b791:
      printf("\n  . Loading the private key ...");
      fflush(_stdout);
      iVar5 = mbedtls_pk_parse_keyfile(&mStack_508,opt.filename,opt.password);
      if (iVar5 == 0) {
        puts(" ok");
        puts("  . Key information    ...");
        mVar6 = mbedtls_pk_get_type(&mStack_508);
        if (mVar6 != MBEDTLS_PK_RSA) {
          mVar6 = mbedtls_pk_get_type(&mStack_508);
          if (mVar6 == MBEDTLS_PK_ECKEY) {
            iVar5 = mbedtls_mpi_write_file
                              ("Q(X): ",(mbedtls_mpi *)
                                        &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x100))->p,0x10,
                               (FILE *)0x0);
            if (((iVar5 == 0) &&
                (iVar5 = mbedtls_mpi_write_file
                                   ("Q(Y): ",(mbedtls_mpi *)
                                             &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x118))->p,
                                    0x10,(FILE *)0x0), iVar5 == 0)) &&
               (iVar5 = mbedtls_mpi_write_file
                                  ("Q(Z): ",(mbedtls_mpi *)
                                            &((mbedtls_mpi *)((long)mStack_508.pk_ctx + 0x130))->p,
                                   0x10,(FILE *)0x0), iVar5 == 0)) {
              pmVar2 = (mbedtls_mpi *)((long)mStack_508.pk_ctx + 0xe8);
              pcVar8 = "D   : ";
              goto LAB_0010b743;
            }
            goto LAB_0010b950;
          }
          goto LAB_0010b977;
        }
        iVar5 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_4e0,&local_450,
                                   &local_468,&local_480,&local_4f8);
        if ((iVar5 == 0) &&
           (iVar5 = mbedtls_rsa_export_crt
                              ((mbedtls_rsa_context *)mStack_508.pk_ctx,&local_498,&local_4b0,
                               &local_4c8), iVar5 == 0)) {
          iVar5 = mbedtls_mpi_write_file("N:  ",&local_4e0,0x10,(FILE *)0x0);
          cVar11 = '\x03';
          if (((iVar5 == 0) &&
              (iVar5 = mbedtls_mpi_write_file("E:  ",&local_4f8,0x10,(FILE *)0x0), iVar5 == 0)) &&
             ((iVar5 = mbedtls_mpi_write_file("D:  ",&local_480,0x10,(FILE *)0x0), iVar5 == 0 &&
              ((((iVar5 = mbedtls_mpi_write_file("P:  ",&local_450,0x10,(FILE *)0x0), iVar5 == 0 &&
                 (iVar5 = mbedtls_mpi_write_file("Q:  ",&local_468,0x10,(FILE *)0x0), iVar5 == 0))
                && (iVar5 = mbedtls_mpi_write_file("DP: ",&local_498,0x10,(FILE *)0x0), iVar5 == 0))
               && (iVar5 = mbedtls_mpi_write_file("DQ:  ",&local_4b0,0x10,(FILE *)0x0), iVar5 == 0))
              )))) {
            iVar5 = mbedtls_mpi_write_file("QP:  ",&local_4c8,0x10,(FILE *)0x0);
            cVar11 = (iVar5 != 0) * '\x03';
          }
        }
        else {
          puts(" failed\n  ! could not export RSA parameters\n");
          cVar11 = '\x03';
        }
        goto joined_r0x0010b8bd;
      }
      pcVar8 = " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n";
      goto LAB_0010b7d5;
    }
    printf("\n  . Loading the password file ...");
    __stream = fopen(opt.password_file,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar8 = " failed\n  !  fopen returned NULL";
LAB_0010b773:
      puts(pcVar8);
      iVar5 = 3;
    }
    else {
      pcVar8 = fgets(local_438,0x400,__stream);
      fclose(__stream);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "Error: fgets() failed to retrieve password";
        goto LAB_0010b773;
      }
      sVar9 = strlen(local_438);
      lVar10 = (long)((sVar9 << 0x20) + -0x100000000) >> 0x20;
      if (local_438[lVar10] == '\n') {
        local_438[lVar10] = '\0';
      }
      lVar10 = (long)((sVar9 << 0x20) + -0x200000000) >> 0x20;
      if (local_438[lVar10] == '\r') {
        local_438[lVar10] = '\0';
      }
      iVar5 = 0;
      opt.password = local_438;
    }
    if (iVar5 != 3) {
      if (iVar5 != 0) {
        return 0;
      }
      goto LAB_0010b791;
    }
  }
  else {
LAB_0010b4a6:
    printf(
          "\n usage: key_app param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    password=%%s         default: \"\"\n    password_file=%%s    default: \"\"\n\n"
          );
  }
  bVar1 = false;
  iVar13 = 1;
  iVar5 = 1;
LAB_0010b4c1:
  if (!bVar1) {
    mbedtls_strerror(iVar5,local_438,0x400);
    printf("  !  Last error was: %s\n",local_438);
  }
  mbedtls_pk_free(&mStack_508);
  mbedtls_mpi_free(&local_4e0);
  mbedtls_mpi_free(&local_450);
  mbedtls_mpi_free(&local_468);
  mbedtls_mpi_free(&local_480);
  mbedtls_mpi_free(&local_4f8);
  mbedtls_mpi_free(&local_498);
  mbedtls_mpi_free(&local_4b0);
  mbedtls_mpi_free(&local_4c8);
  return iVar13;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    char buf[1024];
    int i;
    char *p, *q;

    mbedtls_pk_context pk;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &pk );
    memset( buf, 0, sizeof(buf) );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto cleanup;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.password            = DFL_PASSWORD;
    opt.password_file       = DFL_PASSWORD_FILE;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "password" ) == 0 )
            opt.password = q;
        else if( strcmp( p, "password_file" ) == 0 )
            opt.password_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        if( strlen( opt.password ) && strlen( opt.password_file ) )
        {
            mbedtls_printf( "Error: cannot have both password and password_file\n" );
            goto usage;
        }

        if( strlen( opt.password_file ) )
        {
            FILE *f;

            mbedtls_printf( "\n  . Loading the password file ..." );
            if( ( f = fopen( opt.password_file, "rb" ) ) == NULL )
            {
                mbedtls_printf( " failed\n  !  fopen returned NULL\n" );
                goto cleanup;
            }
            if( fgets( buf, sizeof(buf), f ) == NULL )
            {
                fclose( f );
                mbedtls_printf( "Error: fgets() failed to retrieve password\n" );
                goto cleanup;
            }
            fclose( f );

            i = (int) strlen( buf );
            if( buf[i - 1] == '\n' ) buf[i - 1] = '\0';
            if( buf[i - 2] == '\r' ) buf[i - 2] = '\0';
            opt.password = buf;
        }

        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &pk, opt.filename, opt.password );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
                ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D:  ", &D, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "P:  ", &P, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q:  ", &Q, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DP: ", &DP, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &pk, opt.filename );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export( rsa, &N, NULL, NULL,
                                            NULL, &E ) ) != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else
        goto usage;

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:

#if defined(MBEDTLS_ERROR_C)
    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

    mbedtls_pk_free( &pk );
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}